

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O3

void __thiscall FM::OPNABase::Mix6(OPNABase *this,Sample *buffer,int nsamples,int activech)

{
  short *psVar1;
  uint uVar2;
  ISample IVar3;
  int iVar4;
  short sVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  Sample *dest;
  Channel4 *pCVar9;
  ISample out [6];
  ISample aIStack_48 [6];
  
  if (0 < nsamples) {
    psVar1 = buffer + nsamples * 2;
    do {
      if ((activech & 0xaaaU) == 0) {
        lVar8 = 0;
        pCVar9 = (Channel4 *)&this->field_0x280;
        do {
          if ((*(uint *)((long)&DAT_001ee1e0 + lVar8) & activech) == 0) {
            IVar3 = 0;
          }
          else {
            IVar3 = Channel4::Calc(pCVar9);
          }
          *(ISample *)((long)aIStack_48 + lVar8) = IVar3;
          lVar8 = lVar8 + 4;
          pCVar9 = pCVar9 + 1;
        } while (lVar8 != 0x18);
      }
      else {
        uVar2 = this->lfocount;
        uVar7 = (ulong)(uVar2 >> 0xd & 0x3fc);
        (this->super_OPNBase).chip.pml_ = (uint)(byte)pmtable[uVar7];
        (this->super_OPNBase).chip.aml_ = (uint)*(byte *)((long)&amtable + uVar7);
        this->lfocount = uVar2 + this->lfodcount;
        lVar8 = 0;
        pCVar9 = (Channel4 *)&this->field_0x280;
        do {
          if ((*(uint *)((long)&DAT_001ee1e0 + lVar8) & activech) == 0) {
            IVar3 = 0;
          }
          else {
            IVar3 = Channel4::CalcL(pCVar9);
          }
          *(ISample *)((long)aIStack_48 + lVar8) = IVar3;
          lVar8 = lVar8 + 4;
          pCVar9 = pCVar9 + 1;
        } while (lVar8 != 0x18);
      }
      lVar8 = 0;
      iVar4 = 0;
      iVar6 = 0;
      do {
        iVar6 = iVar6 + (int)(((int)((uint)this->pan[lVar8] << 0x1e) >> 0x1f &
                              (uint)this->panvolume_l[lVar8]) * aIStack_48[lVar8]) / 0xffff;
        iVar4 = iVar4 + (int)((-(this->pan[lVar8] & 1) & (uint)this->panvolume_r[lVar8]) *
                             aIStack_48[lVar8]) / 0xffff;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 6);
      iVar6 = iVar6 + *buffer;
      if (iVar6 < -0x7fff) {
        iVar6 = -0x8000;
      }
      sVar5 = (short)iVar6;
      if (0x7ffe < iVar6) {
        sVar5 = 0x7fff;
      }
      *buffer = sVar5;
      iVar4 = iVar4 + buffer[1];
      if (iVar4 < -0x7fff) {
        iVar4 = -0x8000;
      }
      if (0x7ffe < iVar4) {
        iVar4 = 0x7fff;
      }
      buffer[1] = (short)iVar4;
      buffer = buffer + 2;
    } while (buffer < psVar1);
  }
  return;
}

Assistant:

void OPNABase::Mix6(Sample* buffer, int nsamples, int activech)
{
	// Mix
	// libOPNMIDI: rewrite for panning support

	const uint activechmask[6] = {0x001, 0x004, 0x010, 0x040, 0x100, 0x400};

	Sample* limit = buffer + nsamples * 2;
	for (Sample* dest = buffer; dest < limit; dest+=2)
	{
		ISample out[6];
		if (activech & 0xaaa)
		{
			LFO();
			for (uint c = 0; c<6; ++c)
				out[c] = (activechmask[c] & activech) ? ch[c].CalcL() : 0;
		}
		else
		{
			for (uint c = 0; c<6; ++c)
				out[c] = (activechmask[c] & activech) ? ch[c].Calc() : 0;
		}

		int lrouts[2] = {0, 0};
		for (uint c = 0; c<6; ++c)
		{
			int panl = panvolume_l[c];
			int panr = panvolume_r[c];
			panl = (pan[c] & 2) ? panl : 0;
			panr = (pan[c] & 1) ? panr : 0;
			lrouts[0] += out[c] * panl / 65535;
			lrouts[1] += out[c] * panr / 65535;
		}

		StoreSample(dest[0], lrouts[0]);
		StoreSample(dest[1], lrouts[1]);
	}
}